

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O1

void __thiscall
kratos::StmtBlock::add_scope_variable
          (StmtBlock *this,string *name,string *value,bool is_var,bool override)

{
  pointer psVar1;
  element_type *peVar2;
  shared_ptr<kratos::Stmt> *stmt;
  pointer psVar3;
  
  Stmt::add_scope_variable(&this->super_Stmt,name,value,is_var,override);
  psVar3 = (this->stmts_).
           super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->stmts_).
           super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar3 != psVar1) {
    do {
      peVar2 = (psVar3->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      (*(peVar2->super_IRNode)._vptr_IRNode[8])(peVar2,name,value,(ulong)is_var,(ulong)override);
      psVar3 = psVar3 + 1;
    } while (psVar3 != psVar1);
  }
  return;
}

Assistant:

void StmtBlock::add_scope_variable(const std::string &name, const std::string &value, bool is_var,
                                   bool override) {
    Stmt::add_scope_variable(name, value, is_var, override);
    for (auto &stmt : stmts_) {
        stmt->add_scope_variable(name, value, is_var, override);
    }
}